

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structdeclnode.cpp
# Opt level: O0

void __thiscall
StructDeclNode::check
          (StructDeclNode *this,
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          *tables)

{
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *this_00;
  bool bVar1;
  size_type sVar2;
  SemanticException *pSVar3;
  map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
  *pmVar4;
  pointer pAVar5;
  pointer pAVar6;
  pointer pTVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_bool>
  pVar8;
  allocator local_3d1;
  string local_3d0;
  string local_3b0;
  allocator local_389;
  string local_388;
  SymbolInfo local_368;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_308;
  unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *local_288;
  unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
  *__range1;
  _Rb_tree_node_base _Stack_260;
  size_t sStack_240;
  _Base_ptr local_230;
  undefined1 local_228;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  SymbolInfo local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_150;
  undefined1 local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [8];
  string structScope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *local_18;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *tables_local;
  StructDeclNode *this_local;
  
  local_18 = tables;
  tables_local = (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                  *)this;
  bVar1 = wasDeclared(tables,&this->name);
  if (bVar1) {
    structScope.field_2._M_local_buf[0xb] = '\x01';
    pSVar3 = (SemanticException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,"error: multiple definition of struct \'",&this->name);
    std::operator+(&local_38,&local_58,"\'");
    SemanticException::SemanticException(pSVar3,&local_38);
    structScope.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pSVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
  }
  std::__cxx11::string::string(local_88);
  sVar2 = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          ::size(local_18);
  if (sVar2 == 1) {
    std::__cxx11::string::operator=(local_88,"global");
    pmVar4 = (map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
              *)std::
                vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                ::back(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"struct",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"???",&local_1f9);
    std::__cxx11::string::string((string *)&local_220,local_88);
    SymbolInfo::SymbolInfo(&local_1b0,&local_1d0,&local_1f8,&local_220);
    std::make_pair<std::__cxx11::string&,SymbolInfo>(&local_150,&this->name,&local_1b0);
    pVar8 = std::
            map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
            ::emplace<std::pair<std::__cxx11::string,SymbolInfo>>(pmVar4,&local_150);
    local_230 = (_Base_ptr)pVar8.first._M_node;
    local_228 = pVar8.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::~pair(&local_150);
    SymbolInfo::~SymbolInfo(&local_1b0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_88);
    this_00 = local_18;
    _Stack_260._M_right = (_Base_ptr)0x0;
    sStack_240 = 0;
    _Stack_260._M_parent = (_Base_ptr)0x0;
    _Stack_260._M_left = (_Base_ptr)0x0;
    __range1 = (vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
                *)0x0;
    _Stack_260._M_color = _S_red;
    _Stack_260._4_4_ = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
           *)&__range1);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::push_back(this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                         *)&__range1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
            *)&__range1);
    __end1 = std::
             vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
             ::begin(&this->fields);
    f = (unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *)
        std::
        vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
        ::end(&this->fields);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                                  *)&f);
      if (!bVar1) break;
      local_288 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                  ::operator*(&__end1);
      pmVar4 = (map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)std::
                  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                  ::back(local_18);
      pAVar5 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_288);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_388,"field",&local_389);
      pAVar6 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_288);
      pTVar7 = std::unique_ptr<TypeNode,_std::default_delete<TypeNode>_>::operator->(&pAVar6->type);
      std::__cxx11::string::string((string *)&local_3b0,(string *)&pTVar7->name);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3d0,"local",&local_3d1);
      SymbolInfo::SymbolInfo(&local_368,&local_388,&local_3b0,&local_3d0);
      std::make_pair<std::__cxx11::string&,SymbolInfo>
                (&local_308,&(pAVar5->super_VarNode).name,&local_368);
      std::
      map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
      ::emplace<std::pair<std::__cxx11::string,SymbolInfo>>(pmVar4,&local_308);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
      ::~pair(&local_308);
      SymbolInfo::~SymbolInfo(&local_368);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::pop_back(local_18);
    return;
  }
  std::__cxx11::string::operator=(local_88,"local");
  local_c9 = 1;
  pSVar3 = (SemanticException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,"error: struct \'",&this->name);
  std::operator+(&local_a8,&local_c8,"\' can only be declared in the global scope");
  SemanticException::SemanticException(pSVar3,&local_a8);
  local_c9 = 0;
  __cxa_throw(pSVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
}

Assistant:

void StructDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, name)) {
        throw SemanticException("error: multiple definition of struct '" + name + "'");
    } else {
        auto structScope = std::string();
        if (tables.size() == 1) {
            structScope = "global";
        } else {
            structScope = "local"; // this is an error
            // TODO: Need to handle methods
            throw SemanticException("error: struct '" + name + "' can only be declared in the global scope");
        }
        tables.back().emplace(std::make_pair(name, SymbolInfo("struct", "???", structScope)));
//        std::cout << "new struct added to table: named " << name << ", scope: " << structScope << "\n";
    }

    // make a new scope for the fields
    tables.push_back(SymbolTable());

    for (const auto& f : fields) {
        tables.back().emplace(std::make_pair(f->name, SymbolInfo("field", f->type->name, "local")));
//        std::cout << "new field added to table: named " << f->name << ", type: "
//                  << f->type->name << ", scope: " << "local" << "\n";
    }

    tables.pop_back();
}